

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleSampleMaskiTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest::iterate
          (MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint gl_max_sample_mask_words_value;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  gl_max_sample_mask_words_value = 0;
  (**(code **)(lVar2 + 0x868))(0x8e59,&gl_max_sample_mask_words_value);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
                  ,0xcf);
  (**(code **)(lVar2 + 0x1258))(gl_max_sample_mask_words_value + 1);
  iVar1 = (**(code **)(lVar2 + 0x800))();
  if (iVar1 == 0x501) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid error code reported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleSampleMaskiTests.cpp"
             ,0xd6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest::iterate()
{
	/* Get GL_MAX_SAMPLE_MASK_WORDS value */
	const glw::Functions& gl							 = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_sample_mask_words_value = 0;

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &gl_max_sample_mask_words_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLE_MASK_WORDS value");

	/* Issue call with valid parameters, but invalid index greater than GL_MAX_SAMPLE_MASK_WORDS value */
	gl.sampleMaski(gl_max_sample_mask_words_value + 1, 0);

	if (gl.getError() != GL_INVALID_VALUE)
	{
		TCU_FAIL("Invalid error code reported");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}